

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

optional<unsigned_long> __thiscall
absl::lts_20250127::status_internal::FindPayloadIndexByUrl
          (status_internal *this,Payloads *payloads,string_view type_url)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  unsigned_long uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  optional<unsigned_long> oVar5;
  unsigned_long local_40;
  size_t i;
  status_internal *local_30;
  Payloads *payloads_local;
  string_view type_url_local;
  undefined1 local_10;
  
  type_url_local._M_len = type_url._M_len;
  local_30 = this;
  payloads_local = payloads;
  if (this == (status_internal *)0x0) {
    std::optional<unsigned_long>::optional
              ((optional<unsigned_long> *)&type_url_local._M_str,payloads,type_url_local._M_len,
               type_url._M_str);
    uVar4 = extraout_RDX;
  }
  else {
    local_40 = 0;
    while( true ) {
      uVar1 = local_40;
      sVar3 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
              ::size((InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                      *)local_30);
      if (sVar3 <= uVar1) break;
      this_00 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                ::operator[]((InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                              *)local_30,local_40);
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      __y._M_str = (char *)type_url_local._M_len;
      __y._M_len = (size_t)payloads_local;
      bVar2 = std::operator==(__x,__y);
      if (bVar2) {
        std::optional<unsigned_long>::optional<unsigned_long,_true>
                  ((optional<unsigned_long> *)&type_url_local._M_str,&local_40);
        uVar4 = extraout_RDX_00;
        goto LAB_01bb7e71;
      }
      local_40 = local_40 + 1;
    }
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&type_url_local._M_str);
    uVar4 = extraout_RDX_01;
  }
LAB_01bb7e71:
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_10;
  oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)type_url_local._M_str;
  return (optional<unsigned_long>)
         oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

static absl::optional<size_t> FindPayloadIndexByUrl(
    const Payloads* payloads, absl::string_view type_url) {
  if (payloads == nullptr) return absl::nullopt;

  for (size_t i = 0; i < payloads->size(); ++i) {
    if ((*payloads)[i].type_url == type_url) return i;
  }

  return absl::nullopt;
}